

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

void test_evp_fp_nan(void)

{
  return;
}

Assistant:

void test_evp_fp_nan()
{
  typedef compact_optional<evp_fp_nan<double>> opt_double;
  opt_double o_, o1 (1.0), oNan (0.0/0.0);
  assert (!o_.has_value());
  assert ( o1.has_value());
  assert (!oNan.has_value());
  
  assert (o1.value() == 1.0);
  
  double v = o_.unsafe_raw_value();
  assert (v != v);
  
  v = o1.unsafe_raw_value();
  assert (v == 1.0);
  assert (v == v);
  
  v = oNan.unsafe_raw_value();
  assert (v != v);
}